

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

void moira::sprintd(char **s,u64 value)

{
  uint uVar1;
  long lVar2;
  double dVar3;
  
  if (value == 0) {
    uVar1 = 1;
  }
  else {
    dVar3 = log10((double)(long)value);
    uVar1 = (int)dVar3 + 1;
  }
  if (0 < (int)uVar1) {
    lVar2 = (ulong)uVar1 + 1;
    do {
      (*s)[lVar2 + -2] = (char)value + (char)(value / 10) * -10 | 0x30;
      lVar2 = lVar2 + -1;
      value = value / 10;
    } while (1 < lVar2);
  }
  *s = *s + (int)uVar1;
  return;
}

Assistant:

static void sprintd(char *&s, u64 value)
{
    sprintd(s, value, decDigits(value));
}